

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

PNode * heap_pop(VecPNode *a)

{
  uint uVar1;
  PNode **ppPVar2;
  PNode *pPVar3;
  uint uVar4;
  
  uVar4 = a->n;
  if (uVar4 == 0) {
    pPVar3 = (PNode *)0x0;
  }
  else {
    ppPVar2 = a->v;
    pPVar3 = *ppPVar2;
    uVar1 = uVar4 - 1;
    *ppPVar2 = ppPVar2[uVar1];
    a->n = uVar1;
    if (2 < uVar4) {
      uVar4 = (uVar1 >> 1) + 1;
      do {
        heapify(a,uVar4 - 2);
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
  }
  return pPVar3;
}

Assistant:

PNode *heap_pop(VecPNode *a) {
  if (a->n == 0) return NULL;
  PNode *pn = a->v[0];
  a->v[0] = a->v[a->n -1];
  a->n--;
  for (int i = a->n / 2 - 1; i >= 0; i--)
    heapify(a, i);
  return pn;
}